

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>::
insert<kj::TreeMap<int,kj::StringPtr>::Entry,int&>
          (TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<int,_kj::StringPtr>::Entry> table,size_t pos,int *params)

{
  uint uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  ulong uVar3;
  int *in_R9;
  Maybe<unsigned_long> MVar4;
  Iterator iter;
  ArrayPtr<kj::TreeMap<int,_kj::StringPtr>::Entry> table_local;
  SearchKey local_40;
  StringPtr *local_38;
  ArrayPtr<kj::TreeMap<int,_kj::StringPtr>::Entry> *local_30;
  
  table_local.ptr = (StringPtr *)table.size_;
  local_38 = table.ptr;
  local_30 = &table_local;
  local_40._vptr_SearchKey = (_func_char_7_ **)&PTR_search_0021c400;
  table_local.size_ = pos;
  _::BTreeImpl::insert(&iter,(BTreeImpl *)&(local_38->content).size_,&local_40);
  aVar2.value._4_4_ = 0;
  aVar2.value._0_4_ = iter.row;
  if (aVar2.value == 0xe) {
    aVar2.value = 0xe;
  }
  else {
    uVar1 = (iter.leaf)->rows[aVar2.value].i;
    if ((uVar1 != 0) &&
       (uVar3 = (ulong)(uVar1 - 1), *(int *)((long)table_local.ptr + uVar3 * 0x18) == *in_R9)) {
      *this = (TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>)0x1;
      *(ulong *)(this + 8) = uVar3;
      goto LAB_001702c2;
    }
  }
  memmove((iter.leaf)->rows + aVar2.value + 1,(iter.leaf)->rows + aVar2.value,
          (ulong)(iter.row + 1) * -4 + 0x38);
  (iter.leaf)->rows[aVar2.value].i = (int)params + 1;
  *this = (TreeIndex<kj::TreeMap<int,kj::StringPtr>::Callbacks>)0x0;
  aVar2 = extraout_RDX;
LAB_001702c2:
  MVar4.ptr.field_1.value = aVar2.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }